

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void SendMessageAck(MQTT_CLIENT *mqtt_client,uint16_t packetId,QOS_VALUE qosValue)

{
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t length;
  uchar *data;
  STRING_HANDLE trace_log;
  char *local_60;
  STRING_HANDLE ack_trace_log;
  LOGGER_LOG l_2;
  size_t size;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER_HANDLE pubRel;
  CONTROL_PACKET_TYPE response_packet_type;
  QOS_VALUE qosValue_local;
  uint16_t packetId_local;
  MQTT_CLIENT *mqtt_client_local;
  
  pubRel._4_4_ = 0xe2;
  l = (LOGGER_LOG)0x0;
  if (qosValue == DELIVER_EXACTLY_ONCE) {
    l = (LOGGER_LOG)mqtt_codec_publishReceived(packetId);
    if ((BUFFER_HANDLE)l == (BUFFER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"SendMessageAck",0x289,1,"Failed to allocate publish receive message.");
      }
      set_error_callback(mqtt_client,MQTT_CLIENT_MEMORY_ERROR);
    }
    pubRel._4_4_ = 0x50;
  }
  else if (qosValue == DELIVER_AT_LEAST_ONCE) {
    l = (LOGGER_LOG)mqtt_codec_publishAck(packetId);
    if ((BUFFER_HANDLE)l == (BUFFER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"SendMessageAck",0x294,1,"Failed to allocate publish ack message.");
      }
      set_error_callback(mqtt_client,MQTT_CLIENT_MEMORY_ERROR);
    }
    pubRel._4_4_ = 0x40;
  }
  if (l != (LOGGER_LOG)0x0) {
    length = BUFFER_length((BUFFER_HANDLE)l);
    data = BUFFER_u_char((BUFFER_HANDLE)l);
    iVar2 = sendPacketItem(mqtt_client,data,length);
    if (iVar2 == 0) {
      _Var1 = is_trace_enabled(mqtt_client);
      if (_Var1) {
        if (pubRel._4_4_ == 0x40) {
          local_60 = "PUBACK";
        }
        else {
          local_60 = "UNDEFINED";
          if (pubRel._4_4_ == 0x50) {
            local_60 = "PUBREC";
          }
        }
        trace_log = STRING_construct_sprintf("%s | PACKET_ID: %u",local_60,(ulong)packetId);
        log_outgoing_trace(mqtt_client,trace_log);
        STRING_delete(trace_log);
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"SendMessageAck",0x2a0,1,"Failed sending publish reply.");
      }
      set_error_callback(mqtt_client,MQTT_CLIENT_COMMUNICATION_ERROR);
    }
    BUFFER_delete((BUFFER_HANDLE)l);
  }
  return;
}

Assistant:

static void SendMessageAck(MQTT_CLIENT* mqtt_client, uint16_t packetId, QOS_VALUE qosValue)
{
    CONTROL_PACKET_TYPE response_packet_type = UNKNOWN_TYPE;
    BUFFER_HANDLE pubRel = NULL;
    if (qosValue == DELIVER_EXACTLY_ONCE)
    {
        pubRel = mqtt_codec_publishReceived(packetId);
        if (pubRel == NULL)
        {
            LogError("Failed to allocate publish receive message.");
            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
        }

        response_packet_type = PUBREC_TYPE;
    }
    else if (qosValue == DELIVER_AT_LEAST_ONCE)
    {
        pubRel = mqtt_codec_publishAck(packetId);
        if (pubRel == NULL)
        {
            LogError("Failed to allocate publish ack message.");
            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
        }

        response_packet_type = PUBACK_TYPE;
    }

    if (pubRel != NULL)
    {
        size_t size = BUFFER_length(pubRel);
        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
        {
            LogError("Failed sending publish reply.");
            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
        }
#ifndef NO_LOGGING
        else if (is_trace_enabled(mqtt_client))
        {
            STRING_HANDLE ack_trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, 
                response_packet_type == PUBACK_TYPE ? "PUBACK" : ((response_packet_type == PUBREC_TYPE) ? "PUBREC" : "UNDEFINED"),
                packetId);

            log_outgoing_trace(mqtt_client, ack_trace_log);
            STRING_delete(ack_trace_log);
        }
#endif
        BUFFER_delete(pubRel);
    }
}